

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_byte_array_decoder.cpp
# Opt level: O2

void duckdb::DeltaByteArrayDecoder::ReadDbpData
               (Allocator *allocator,ResizeableBuffer *buffer,ResizeableBuffer *result_buffer,
               idx_t *value_count)

{
  uint64_t *args_1;
  idx_t iVar1;
  uint64_t uVar2;
  pointer pDVar3;
  templated_unique_single_t decoder;
  unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>_> uStack_38;
  
  args_1 = &(buffer->super_ByteBuffer).len;
  make_uniq<duckdb::DbpDecoder,unsigned_char*&,unsigned_long&>
            ((duckdb *)&uStack_38,(uchar **)buffer,args_1);
  pDVar3 = unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>,_true>::operator->
                     ((unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>,_true>
                       *)&uStack_38);
  *value_count = pDVar3->total_value_count;
  iVar1 = result_buffer->alloc_len;
  (result_buffer->super_ByteBuffer).ptr = *(data_ptr_t *)&result_buffer->field_0x18;
  (result_buffer->super_ByteBuffer).len = iVar1;
  ResizeableBuffer::resize(result_buffer,allocator,*value_count << 2);
  pDVar3 = unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>,_true>::operator->
                     ((unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>,_true>
                       *)&uStack_38);
  DbpDecoder::GetBatch<unsigned_int>(pDVar3,(result_buffer->super_ByteBuffer).ptr,*value_count);
  pDVar3 = unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>,_true>::operator->
                     ((unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>,_true>
                       *)&uStack_38);
  DbpDecoder::Finalize(pDVar3);
  uVar2 = *args_1;
  pDVar3 = unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>,_true>::operator->
                     ((unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>,_true>
                       *)&uStack_38);
  ByteBuffer::inc(&buffer->super_ByteBuffer,uVar2 - (pDVar3->buffer_).len);
  std::unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>_>::~unique_ptr
            (&uStack_38);
  return;
}

Assistant:

void DeltaByteArrayDecoder::ReadDbpData(Allocator &allocator, ResizeableBuffer &buffer, ResizeableBuffer &result_buffer,
                                        idx_t &value_count) {
	auto decoder = make_uniq<DbpDecoder>(buffer.ptr, buffer.len);
	value_count = decoder->TotalValues();
	result_buffer.reset();
	result_buffer.resize(allocator, sizeof(uint32_t) * value_count);
	decoder->GetBatch<uint32_t>(result_buffer.ptr, value_count);
	decoder->Finalize();
	buffer.inc(buffer.len - decoder->BufferPtr().len);
}